

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long stop;
  PrimeExtractor *this;
  char *pEnd;
  
  stop = strtol(argv[1],&pEnd,10);
  this = (PrimeExtractor *)operator_new(0x40);
  PrimeExtractor::PrimeExtractor(this,stop);
  PrimeExtractor::extract(this);
  PrimeExtractor::~PrimeExtractor(this);
  operator_delete(this,0x40);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    
    char * pEnd;
    long range = strtol(argv[1], &pEnd, 10);
  
    PrimeExtractor * pe = new PrimeExtractor(range);
    pe->extract();
    
    delete pe;
    return 0;
    
}